

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress2.c
# Opt level: O3

void Abc_NtkDressMapSetPolarity(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  void *pvVar2;
  long lVar3;
  Vec_Ptr_t *pVVar4;
  ulong uVar5;
  
  pVVar4 = pNtk->vObjs;
  if (0 < pVVar4->nSize) {
    lVar3 = 0;
    do {
      pvVar2 = pVVar4->pArray[lVar3];
      if (pvVar2 != (void *)0x0) {
        uVar5 = *(ulong *)((long)pvVar2 + 0x40) & 0xfffffffffffffffe;
        if ((uVar5 != 0) && (uVar1 = *(uint *)(uVar5 + 0x14), (uVar1 & 0xf) != 0)) {
          *(uint *)((long)pvVar2 + 0x14) =
               *(uint *)((long)pvVar2 + 0x14) & 0xffffff7f |
               (uVar1 ^ (int)*(ulong *)((long)pvVar2 + 0x40) << 7) & 0x80;
          pVVar4 = pNtk->vObjs;
        }
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < pVVar4->nSize);
  }
  return;
}

Assistant:

void Abc_NtkDressMapSetPolarity( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj, * pAnd;
    int i;
    // each node refers to the the strash copy whose polarity is set
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
        if ( (pAnd = Abc_ObjRegular(pObj->pCopy)) && Abc_ObjType(pAnd) != ABC_OBJ_NONE ) // strashed object is present and legal
            pObj->fPhase = pAnd->fPhase ^ Abc_ObjIsComplement(pObj->pCopy);
    }
}